

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

GLFWcursor * glfwCreateCursor(GLFWimage *image,int xhot,int yhot)

{
  int iVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  GLFWcursor *in_RDI;
  _GLFWcursor *cursor;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  GLFWimage *local_8;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_8 = (GLFWimage *)0x0;
  }
  else {
    local_8 = (GLFWimage *)calloc(1,0x10);
    *(_GLFWcursor **)local_8 = _glfw.cursorListHead;
    _glfw.cursorListHead = (_GLFWcursor *)local_8;
    iVar1 = _glfwPlatformCreateCursor
                      ((_GLFWcursor *)CONCAT44(in_ESI,in_EDX),local_8,in_stack_ffffffffffffffdc,
                       in_stack_ffffffffffffffd8);
    if (iVar1 == 0) {
      glfwDestroyCursor(in_RDI);
      local_8 = (GLFWimage *)0x0;
    }
  }
  return (GLFWcursor *)local_8;
}

Assistant:

GLFWAPI GLFWcursor* glfwCreateCursor(const GLFWimage* image, int xhot, int yhot)
{
    _GLFWcursor* cursor;

    assert(image != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    cursor = calloc(1, sizeof(_GLFWcursor));
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;

    if (!_glfwPlatformCreateCursor(cursor, image, xhot, yhot))
    {
        glfwDestroyCursor((GLFWcursor*) cursor);
        return NULL;
    }

    return (GLFWcursor*) cursor;
}